

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

pointer __thiscall
slang::SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl>::
emplaceRealloc<slang::ast::DefinitionSymbol::ParameterDecl_const&>
          (SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl> *this,pointer pos,
          ParameterDecl *args)

{
  size_t *psVar1;
  SourceLocation *pSVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  ulong uVar5;
  pointer p;
  anon_union_8_3_62382250_for_ParameterDecl_0 aVar6;
  anon_union_8_3_4d6ead1c_for_ParameterDecl_2 aVar7;
  size_t sVar8;
  char *pcVar9;
  SourceLocation SVar10;
  SourceLocation SVar11;
  size_t sVar12;
  anon_union_8_3_62382250_for_ParameterDecl_0 aVar13;
  anon_union_8_3_62382250_for_ParameterDecl_0 aVar14;
  anon_union_8_3_62382250_for_ParameterDecl_0 aVar15;
  anon_union_8_3_62382250_for_ParameterDecl_0 aVar16;
  anon_union_8_3_62382250_for_ParameterDecl_0 aVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  pointer pPVar25;
  anon_union_8_3_62382250_for_ParameterDecl_0 *paVar26;
  anon_union_8_3_62382250_for_ParameterDecl_0 *paVar27;
  long lVar28;
  long lVar29;
  ulong uVar30;
  long lVar31;
  
  if (this->len == 0x1ffffffffffffff) {
    detail::throwLengthError();
  }
  uVar30 = this->len + 1;
  uVar5 = this->cap;
  if (uVar30 < uVar5 * 2) {
    uVar30 = uVar5 * 2;
  }
  if (0x1ffffffffffffff - uVar5 < uVar5) {
    uVar30 = 0x1ffffffffffffff;
  }
  lVar31 = (long)pos - (long)this->data_;
  paVar27 = (anon_union_8_3_62382250_for_ParameterDecl_0 *)operator_new(uVar30 << 6);
  aVar6 = args->field_0;
  aVar7 = args->field_1;
  sVar8 = (args->name)._M_len;
  pcVar9 = (args->name)._M_str;
  SVar10 = args->location;
  SVar11 = (SourceLocation)(args->attributes)._M_ptr;
  sVar12 = *(size_t *)&args->isTypeParam;
  psVar1 = (size_t *)((long)paVar27 + lVar31 + 0x30);
  *psVar1 = (args->attributes)._M_extent._M_extent_value;
  psVar1[1] = sVar12;
  pSVar2 = (SourceLocation *)((long)paVar27 + lVar31 + 0x20);
  *pSVar2 = SVar10;
  pSVar2[1] = SVar11;
  psVar1 = (size_t *)((long)paVar27 + lVar31 + 0x10);
  *psVar1 = sVar8;
  psVar1[1] = (size_t)pcVar9;
  *(anon_union_8_3_62382250_for_ParameterDecl_0 *)((long)paVar27 + lVar31) = aVar6;
  *(anon_union_8_3_4d6ead1c_for_ParameterDecl_2 *)
   ((anon_union_8_3_62382250_for_ParameterDecl_0 *)((long)paVar27 + lVar31) + 1) = aVar7;
  p = this->data_;
  lVar28 = this->len * 0x40;
  lVar29 = (long)p + (lVar28 - (long)pos);
  pPVar25 = p;
  paVar26 = paVar27;
  if (lVar29 == 0) {
    if (this->len != 0) {
      lVar29 = 0;
      do {
        puVar4 = (undefined8 *)((long)&p->field_0 + lVar29);
        uVar18 = *puVar4;
        uVar19 = puVar4[1];
        puVar4 = (undefined8 *)((long)&(p->name)._M_len + lVar29);
        uVar20 = *puVar4;
        uVar21 = puVar4[1];
        puVar4 = (undefined8 *)(&(p->location).field_0x0 + lVar29);
        uVar22 = *puVar4;
        uVar23 = puVar4[1];
        puVar4 = (undefined8 *)((long)&(p->attributes)._M_extent._M_extent_value + lVar29);
        uVar24 = puVar4[1];
        puVar3 = (undefined8 *)((long)paVar27 + lVar29 + 0x30);
        *puVar3 = *puVar4;
        puVar3[1] = uVar24;
        puVar4 = (undefined8 *)((long)paVar27 + lVar29 + 0x20);
        *puVar4 = uVar22;
        puVar4[1] = uVar23;
        puVar4 = (undefined8 *)((long)paVar27 + lVar29 + 0x10);
        *puVar4 = uVar20;
        puVar4[1] = uVar21;
        *(undefined8 *)((long)paVar27 + lVar29) = uVar18;
        ((undefined8 *)((long)paVar27 + lVar29))[1] = uVar19;
        lVar29 = lVar29 + 0x40;
      } while (lVar28 != lVar29);
    }
  }
  else {
    for (; pPVar25 != pos; pPVar25 = pPVar25 + 1) {
      aVar6 = pPVar25->field_0;
      aVar7 = pPVar25->field_1;
      aVar13 = (anon_union_8_3_62382250_for_ParameterDecl_0)(pPVar25->name)._M_len;
      aVar14 = (anon_union_8_3_62382250_for_ParameterDecl_0)(pPVar25->name)._M_str;
      aVar15 = *(anon_union_8_3_62382250_for_ParameterDecl_0 *)&pPVar25->location;
      aVar16 = (anon_union_8_3_62382250_for_ParameterDecl_0)(pPVar25->attributes)._M_ptr;
      aVar17 = *(anon_union_8_3_62382250_for_ParameterDecl_0 *)&pPVar25->isTypeParam;
      paVar26[6] = (anon_union_8_3_62382250_for_ParameterDecl_0)
                   (pPVar25->attributes)._M_extent._M_extent_value;
      paVar26[7] = aVar17;
      paVar26[4] = aVar15;
      paVar26[5] = aVar16;
      paVar26[2] = aVar13;
      paVar26[3] = aVar14;
      *paVar26 = aVar6;
      *(anon_union_8_3_4d6ead1c_for_ParameterDecl_2 *)(paVar26 + 1) = aVar7;
      paVar26 = paVar26 + 8;
    }
    memcpy((void *)((long)paVar27 + lVar31 + 0x40),pos,(lVar29 - 0x40U & 0xffffffffffffffc0) + 0x40)
    ;
  }
  if (p != (pointer)this->firstElement) {
    operator_delete(p);
  }
  this->len = this->len + 1;
  this->cap = uVar30;
  this->data_ = (pointer)paVar27;
  return (pointer)((long)paVar27 + lVar31);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}